

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O2

void __thiscall icu_63::RuleChain::RuleChain(RuleChain *this,RuleChain *other)

{
  UErrorCode UVar1;
  OrConstraint *this_00;
  RuleChain *this_01;
  OrConstraint *that;
  
  this->_vptr_RuleChain = (_func_int **)&PTR__RuleChain_0039ebf8;
  UnicodeString::UnicodeString(&this->fKeyword,&other->fKeyword);
  this->fNext = (RuleChain *)0x0;
  this->ruleHeader = (OrConstraint *)0x0;
  UnicodeString::UnicodeString(&this->fDecimalSamples,&other->fDecimalSamples);
  that = (OrConstraint *)&other->fIntegerSamples;
  UnicodeString::UnicodeString(&this->fIntegerSamples,(UnicodeString *)that);
  this->fDecimalSamplesUnbounded = other->fDecimalSamplesUnbounded;
  this->fIntegerSamplesUnbounded = other->fIntegerSamplesUnbounded;
  UVar1 = other->fInternalStatus;
  this->fInternalStatus = UVar1;
  if (U_ZERO_ERROR < UVar1) {
    return;
  }
  if (other->ruleHeader != (OrConstraint *)0x0) {
    this_00 = (OrConstraint *)UMemory::operator_new((UMemory *)0x20,(size_t)that);
    if (this_00 == (OrConstraint *)0x0) {
      this->ruleHeader = (OrConstraint *)0x0;
      this->fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      that = other->ruleHeader;
      OrConstraint::OrConstraint(this_00,that);
      this->ruleHeader = this_00;
      UVar1 = this_00->fInternalStatus;
      if (U_ZERO_ERROR < UVar1) goto LAB_00264800;
    }
  }
  if (other->fNext == (RuleChain *)0x0) {
    return;
  }
  this_01 = (RuleChain *)UMemory::operator_new((UMemory *)0xe0,(size_t)that);
  if (this_01 == (RuleChain *)0x0) {
    this->fNext = (RuleChain *)0x0;
    UVar1 = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    RuleChain(this_01,other->fNext);
    this->fNext = this_01;
    UVar1 = this_01->fInternalStatus;
    if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
      return;
    }
  }
LAB_00264800:
  this->fInternalStatus = UVar1;
  return;
}

Assistant:

RuleChain::RuleChain(const RuleChain& other) :
        fKeyword(other.fKeyword), fDecimalSamples(other.fDecimalSamples),
        fIntegerSamples(other.fIntegerSamples), fDecimalSamplesUnbounded(other.fDecimalSamplesUnbounded),
        fIntegerSamplesUnbounded(other.fIntegerSamplesUnbounded), fInternalStatus(other.fInternalStatus) {
    if (U_FAILURE(this->fInternalStatus)) {
        return; // stop early if the object we are copying from is invalid. 
    }
    if (other.ruleHeader != nullptr) {
        this->ruleHeader = new OrConstraint(*(other.ruleHeader));
        if (this->ruleHeader == nullptr) {
            this->fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
        }
        else if (U_FAILURE(this->ruleHeader->fInternalStatus)) {
            // If the OrConstraint wasn't fully copied, then set our status to failure as well.
            this->fInternalStatus = this->ruleHeader->fInternalStatus;
            return; // exit early.
        }
    }
    if (other.fNext != nullptr ) {
        this->fNext = new RuleChain(*other.fNext);
        if (this->fNext == nullptr) {
            this->fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
        }
        else if (U_FAILURE(this->fNext->fInternalStatus)) {
            // If the RuleChain wasn't fully copied, then set our status to failure as well.
            this->fInternalStatus = this->fNext->fInternalStatus;
        }
    }
}